

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperOpFailure<unsigned_int,unsigned_long>
          (char *expr1,char *expr2,uint *val1,unsigned_long *val2,char *op)

{
  AssertionResult *other;
  AssertionResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  AssertionResult *value_00;
  AssertionResult *pAVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  AssertionResult AVar2;
  unsigned_long *in_stack_ffffffffffffff10;
  uint *in_stack_ffffffffffffff18;
  char (*in_stack_ffffffffffffff38) [12];
  AssertionResult *in_stack_ffffffffffffff40;
  AssertionResult *this_00;
  string local_90 [32];
  string local_70 [112];
  
  this_00 = in_RDI;
  AssertionFailure();
  AssertionResult::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  other = AssertionResult::operator<<(in_stack_ffffffffffffff40,(char **)in_stack_ffffffffffffff38);
  this = AssertionResult::operator<<
                   (in_stack_ffffffffffffff40,(char (*) [3])in_stack_ffffffffffffff38);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          AssertionResult::operator<<(this,(char **)in_stack_ffffffffffffff38);
  AssertionResult::operator<<(this,(char (*) [3])value);
  AssertionResult::operator<<(this,(char **)value);
  AssertionResult::operator<<(this,(char (*) [12])value);
  FormatForComparisonFailureMessage<unsigned_int,unsigned_long>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  value_00 = AssertionResult::operator<<(this,value);
  pAVar1 = AssertionResult::operator<<(this,(char (*) [5])value);
  FormatForComparisonFailureMessage<unsigned_long,unsigned_int>
            ((unsigned_long *)value_00,(uint *)pAVar1);
  AssertionResult::operator<<(this,value);
  AssertionResult::AssertionResult(this_00,other);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  AssertionResult::~AssertionResult((AssertionResult *)0x135b46);
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}